

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_failf(char *fmt,...)

{
  mpc_parser_t *__ptr;
  char in_AL;
  size_t sVar1;
  mpc_ctor_t p_Var2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  mpc_parser_t *local_38;
  mpc_parser_t *p;
  char *buffer;
  va_list va;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  va[0].reg_save_area = fmt;
  local_38 = mpc_undefined();
  local_38->type = '\x02';
  va[0].overflow_arg_area = local_e8;
  va[0]._0_8_ = &stack0x00000008;
  buffer._4_4_ = 0x30;
  buffer._0_4_ = 8;
  p = (mpc_parser_t *)malloc(0x800);
  vsprintf((char *)p,(char *)va[0].reg_save_area,&buffer);
  __ptr = p;
  sVar1 = strlen((char *)p);
  p_Var2 = (mpc_ctor_t)realloc(__ptr,sVar1 + 1);
  (local_38->data).lift.lf = p_Var2;
  return local_38;
}

Assistant:

mpc_parser_t *mpc_failf(const char *fmt, ...) {

  va_list va;
  char *buffer;

  mpc_parser_t *p = mpc_undefined();
  p->type = MPC_TYPE_FAIL;

  va_start(va, fmt);
  buffer = malloc(2048);
  vsprintf(buffer, fmt, va);
  va_end(va);

  buffer = realloc(buffer, strlen(buffer) + 1);
  p->data.fail.m = buffer;
  return p;

}